

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,UInt value)

{
  allocator local_41;
  char *current;
  char buffer [32];
  char local_18 [8];
  
  current = local_18;
  uintToString((uint)this,&current);
  if (buffer <= current) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,current,&local_41);
    return __return_storage_ptr__;
  }
  __assert_fail("current >= buffer",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/json/impl/json_writer.cpp"
                ,0x53,"std::string Json::valueToString(UInt)");
}

Assistant:

std::string valueToString ( UInt value )
{
    char buffer[32];
    char* current = buffer + sizeof (buffer);
    uintToString ( value, current );
    assert ( current >= buffer );
    return current;
}